

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

Regexp * re2::Regexp::Parse(StringPiece *s,ParseFlags global_flags,RegexpStatus *status)

{
  bool bVar1;
  ParseFlags PVar2;
  int iVar3;
  ParseFlags PVar4;
  ParseStatus PVar5;
  string *utf;
  const_reference pcVar6;
  const_pointer pcVar7;
  const_pointer pcVar8;
  const_pointer pcVar9;
  size_type sVar10;
  UGroup *this;
  CharClassBuilder *pCVar11;
  Regexp *this_00;
  UGroup *in_stack_fffffffffffffc10;
  Rune local_1a4;
  Regexp *pRStack_1a0;
  Rune r_2;
  Regexp *re_2;
  UGroup *g;
  Regexp *re_1;
  undefined1 auStack_180 [4];
  Rune r_3;
  const_pointer pcStack_178;
  StringPiece local_170;
  byte local_159;
  undefined1 auStack_158 [7];
  bool nongreedy_1;
  StringPiece opstr_1;
  int hi;
  int lo;
  const_pointer pcStack_138;
  StringPiece local_130;
  byte local_119;
  undefined1 auStack_118 [7];
  bool nongreedy;
  StringPiece opstr;
  RegexpOp local_fc;
  Regexp *pRStack_f8;
  RegexpOp op;
  Regexp *re;
  Rune local_dc;
  undefined1 auStack_d8 [4];
  Rune r_1;
  StringPiece isunary;
  StringPiece lastunary;
  undefined1 auStack_b0 [4];
  Rune r;
  const_pointer local_a8;
  string *local_a0;
  string *tmp;
  StringPiece t;
  undefined1 local_78 [8];
  ParseState ps;
  RegexpStatus xstatus;
  RegexpStatus *status_local;
  ParseFlags global_flags_local;
  StringPiece *s_local;
  
  RegexpStatus::RegexpStatus((RegexpStatus *)&ps.ncap_);
  xstatus.tmp_ = (string *)status;
  if (status == (RegexpStatus *)0x0) {
    xstatus.tmp_ = (string *)&ps.ncap_;
  }
  ParseState::ParseState((ParseState *)local_78,global_flags,s,(RegexpStatus *)xstatus.tmp_);
  tmp = (string *)s->data_;
  t.data_ = (const_pointer)s->size_;
  PVar2 = operator&(global_flags,Latin1);
  if (PVar2 != NoParseFlags) {
    utf = (string *)operator_new((size_t)in_stack_fffffffffffffc10);
    std::__cxx11::string::string((string *)utf);
    local_a0 = utf;
    ConvertLatin1ToUTF8((StringPiece *)&tmp,utf);
    RegexpStatus::set_tmp((RegexpStatus *)xstatus.tmp_,local_a0);
    StringPiece::StringPiece((StringPiece *)auStack_b0,(string *)local_a0);
    tmp = _auStack_b0;
    t.data_ = local_a8;
  }
  PVar2 = operator&(global_flags,Literal);
  if (PVar2 == NoParseFlags) {
    StringPiece::StringPiece((StringPiece *)&isunary.size_);
    while (bVar1 = StringPiece::empty((StringPiece *)&tmp), ((bVar1 ^ 0xffU) & 1) != 0) {
      StringPiece::StringPiece((StringPiece *)auStack_d8);
      pcVar6 = StringPiece::operator[]((StringPiece *)&tmp,0);
      switch(*pcVar6) {
      case '$':
        bVar1 = ParseState::PushDollar((ParseState *)local_78);
        if (!bVar1) {
          s_local = (StringPiece *)0x0;
          goto LAB_0036cc89;
        }
        StringPiece::remove_prefix((StringPiece *)&tmp,1);
        break;
      default:
        iVar3 = StringPieceToRune(&local_dc,(StringPiece *)&tmp,(RegexpStatus *)xstatus.tmp_);
        if (iVar3 < 0) {
          s_local = (StringPiece *)0x0;
          goto LAB_0036cc89;
        }
        bVar1 = ParseState::PushLiteral((ParseState *)local_78,local_dc);
        if (!bVar1) {
          s_local = (StringPiece *)0x0;
          goto LAB_0036cc89;
        }
        break;
      case '(':
        PVar2 = ParseState::flags((ParseState *)local_78);
        PVar2 = operator&(PVar2,PerlX);
        if (((PVar2 == NoParseFlags) ||
            (sVar10 = StringPiece::size((StringPiece *)&tmp), sVar10 < 2)) ||
           (pcVar6 = StringPiece::operator[]((StringPiece *)&tmp,1), *pcVar6 != '?')) {
          PVar2 = ParseState::flags((ParseState *)local_78);
          PVar2 = operator&(PVar2,NeverCapture);
          if (PVar2 == NoParseFlags) {
            StringPiece::StringPiece((StringPiece *)&re);
            bVar1 = ParseState::DoLeftParen((ParseState *)local_78,(StringPiece *)&re);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              s_local = (StringPiece *)0x0;
              goto LAB_0036cc89;
            }
          }
          else {
            bVar1 = ParseState::DoLeftParenNoCapture((ParseState *)local_78);
            if (!bVar1) {
              s_local = (StringPiece *)0x0;
              goto LAB_0036cc89;
            }
          }
          StringPiece::remove_prefix((StringPiece *)&tmp,1);
        }
        else {
          bVar1 = ParseState::ParsePerlFlags((ParseState *)local_78,(StringPiece *)&tmp);
          if (!bVar1) {
            s_local = (StringPiece *)0x0;
            goto LAB_0036cc89;
          }
        }
        break;
      case ')':
        bVar1 = ParseState::DoRightParen((ParseState *)local_78);
        if (!bVar1) {
          s_local = (StringPiece *)0x0;
          goto LAB_0036cc89;
        }
        StringPiece::remove_prefix((StringPiece *)&tmp,1);
        break;
      case '*':
        local_fc = kRegexpStar;
        goto LAB_0036bdba;
      case '+':
        local_fc = kRegexpPlus;
        goto LAB_0036bdba;
      case '.':
        bVar1 = ParseState::PushDot((ParseState *)local_78);
        if (!bVar1) {
          s_local = (StringPiece *)0x0;
          goto LAB_0036cc89;
        }
        StringPiece::remove_prefix((StringPiece *)&tmp,1);
        break;
      case '?':
        local_fc = kRegexpQuest;
LAB_0036bdba:
        _auStack_118 = tmp;
        opstr.data_ = t.data_;
        local_119 = 0;
        StringPiece::remove_prefix((StringPiece *)&tmp,1);
        PVar2 = ParseState::flags((ParseState *)local_78);
        PVar2 = operator&(PVar2,PerlX);
        if (PVar2 != NoParseFlags) {
          bVar1 = StringPiece::empty((StringPiece *)&tmp);
          if ((!bVar1) && (pcVar6 = StringPiece::operator[]((StringPiece *)&tmp,0), *pcVar6 == '?'))
          {
            local_119 = 1;
            StringPiece::remove_prefix((StringPiece *)&tmp,1);
          }
          bVar1 = StringPiece::empty((StringPiece *)&isunary.size_);
          if (!bVar1) {
            RegexpStatus::set_code((RegexpStatus *)xstatus.tmp_,kRegexpRepeatOp);
            pcVar7 = StringPiece::data((StringPiece *)&isunary.size_);
            pcVar8 = StringPiece::data((StringPiece *)&tmp);
            pcVar9 = StringPiece::data((StringPiece *)&isunary.size_);
            StringPiece::StringPiece(&local_130,pcVar7,(long)pcVar8 - (long)pcVar9);
            RegexpStatus::set_error_arg((RegexpStatus *)xstatus.tmp_,&local_130);
            s_local = (StringPiece *)0x0;
            goto LAB_0036cc89;
          }
        }
        pcVar7 = StringPiece::data((StringPiece *)auStack_118);
        pcVar8 = StringPiece::data((StringPiece *)&tmp);
        pcVar9 = StringPiece::data((StringPiece *)auStack_118);
        StringPiece::StringPiece((StringPiece *)&hi,pcVar7,(long)pcVar8 - (long)pcVar9);
        _auStack_118 = _hi;
        opstr.data_ = pcStack_138;
        bVar1 = ParseState::PushRepeatOp
                          ((ParseState *)local_78,local_fc,(StringPiece *)auStack_118,
                           (bool)(local_119 & 1));
        if (!bVar1) {
          s_local = (StringPiece *)0x0;
          goto LAB_0036cc89;
        }
        _auStack_d8 = _auStack_118;
        isunary.data_ = opstr.data_;
        break;
      case '[':
        bVar1 = ParseState::ParseCharClass
                          ((ParseState *)local_78,(StringPiece *)&tmp,&stack0xffffffffffffff08,
                           (RegexpStatus *)xstatus.tmp_);
        if (!bVar1) {
          s_local = (StringPiece *)0x0;
          goto LAB_0036cc89;
        }
        bVar1 = ParseState::PushRegexp((ParseState *)local_78,pRStack_f8);
        if (!bVar1) {
          s_local = (StringPiece *)0x0;
          goto LAB_0036cc89;
        }
        break;
      case '\\':
        PVar2 = ParseState::flags((ParseState *)local_78);
        PVar2 = operator&(PVar2,PerlB);
        if (((PVar2 == NoParseFlags) ||
            (sVar10 = StringPiece::size((StringPiece *)&tmp), sVar10 < 2)) ||
           ((pcVar6 = StringPiece::operator[]((StringPiece *)&tmp,1), *pcVar6 != 'b' &&
            (pcVar6 = StringPiece::operator[]((StringPiece *)&tmp,1), *pcVar6 != 'B')))) {
          PVar2 = ParseState::flags((ParseState *)local_78);
          PVar2 = operator&(PVar2,PerlX);
          if ((PVar2 == NoParseFlags) ||
             (sVar10 = StringPiece::size((StringPiece *)&tmp), sVar10 < 2)) {
LAB_0036c784:
            sVar10 = StringPiece::size((StringPiece *)&tmp);
            if ((1 < sVar10) &&
               ((pcVar6 = StringPiece::operator[]((StringPiece *)&tmp,1), *pcVar6 == 'p' ||
                (pcVar6 = StringPiece::operator[]((StringPiece *)&tmp,1), *pcVar6 == 'P')))) {
              this = (UGroup *)operator_new((size_t)in_stack_fffffffffffffc10);
              PVar2 = ParseState::flags((ParseState *)local_78);
              PVar4 = operator~(FoldCase);
              PVar2 = operator&(PVar2,PVar4);
              Regexp((Regexp *)this,kRegexpCharClass,PVar2);
              g = this;
              pCVar11 = (CharClassBuilder *)operator_new((size_t)in_stack_fffffffffffffc10);
              CharClassBuilder::CharClassBuilder(pCVar11);
              g->r32 = (URange32 *)pCVar11;
              PVar2 = ParseState::flags((ParseState *)local_78);
              PVar5 = ParseUnicodeGroup((StringPiece *)&tmp,PVar2,(CharClassBuilder *)g->r32,
                                        (RegexpStatus *)xstatus.tmp_);
              if (PVar5 == kParseOk) {
                bVar1 = ParseState::PushRegexp((ParseState *)local_78,(Regexp *)g);
                if (bVar1) break;
                s_local = (StringPiece *)0x0;
                goto LAB_0036cc89;
              }
              if (PVar5 == kParseError) {
                Decref((Regexp *)g);
                s_local = (StringPiece *)0x0;
                goto LAB_0036cc89;
              }
              if (PVar5 == kParseNothing) {
                Decref((Regexp *)g);
              }
            }
            PVar2 = ParseState::flags((ParseState *)local_78);
            re_2 = (Regexp *)MaybeParsePerlCCEscape((StringPiece *)&tmp,PVar2);
            if ((UGroup *)re_2 == (UGroup *)0x0) {
              iVar3 = ParseState::rune_max((ParseState *)local_78);
              bVar1 = ParseEscape((StringPiece *)&tmp,&local_1a4,(RegexpStatus *)xstatus.tmp_,iVar3)
              ;
              if (!bVar1) {
                s_local = (StringPiece *)0x0;
                goto LAB_0036cc89;
              }
              bVar1 = ParseState::PushLiteral((ParseState *)local_78,local_1a4);
              if (!bVar1) {
                s_local = (StringPiece *)0x0;
                goto LAB_0036cc89;
              }
            }
            else {
              this_00 = (Regexp *)operator_new((size_t)in_stack_fffffffffffffc10);
              PVar2 = ParseState::flags((ParseState *)local_78);
              PVar4 = operator~(FoldCase);
              PVar2 = operator&(PVar2,PVar4);
              Regexp(this_00,kRegexpCharClass,PVar2);
              pRStack_1a0 = this_00;
              pCVar11 = (CharClassBuilder *)operator_new((size_t)in_stack_fffffffffffffc10);
              CharClassBuilder::CharClassBuilder(pCVar11);
              (pRStack_1a0->field_7).field_3.ccb_ = pCVar11;
              pCVar11 = (pRStack_1a0->field_7).field_3.ccb_;
              iVar3 = *(int *)&re_2->field_5;
              in_stack_fffffffffffffc10 = (UGroup *)re_2;
              PVar2 = ParseState::flags((ParseState *)local_78);
              AddUGroup(pCVar11,in_stack_fffffffffffffc10,iVar3,PVar2);
              bVar1 = ParseState::PushRegexp((ParseState *)local_78,pRStack_1a0);
              if (!bVar1) {
                s_local = (StringPiece *)0x0;
                goto LAB_0036cc89;
              }
            }
          }
          else {
            pcVar6 = StringPiece::operator[]((StringPiece *)&tmp,1);
            if (*pcVar6 == 'A') {
              bVar1 = ParseState::PushSimpleOp((ParseState *)local_78,kRegexpBeginText);
              if (!bVar1) {
                s_local = (StringPiece *)0x0;
                goto LAB_0036cc89;
              }
              StringPiece::remove_prefix((StringPiece *)&tmp,2);
            }
            else {
              pcVar6 = StringPiece::operator[]((StringPiece *)&tmp,1);
              if (*pcVar6 == 'z') {
                bVar1 = ParseState::PushSimpleOp((ParseState *)local_78,kRegexpEndText);
                if (!bVar1) {
                  s_local = (StringPiece *)0x0;
                  goto LAB_0036cc89;
                }
                StringPiece::remove_prefix((StringPiece *)&tmp,2);
              }
              else {
                pcVar6 = StringPiece::operator[]((StringPiece *)&tmp,1);
                if (*pcVar6 == 'C') {
                  bVar1 = ParseState::PushSimpleOp((ParseState *)local_78,kRegexpAnyByte);
                  if (!bVar1) {
                    s_local = (StringPiece *)0x0;
                    goto LAB_0036cc89;
                  }
                  StringPiece::remove_prefix((StringPiece *)&tmp,2);
                }
                else {
                  pcVar6 = StringPiece::operator[]((StringPiece *)&tmp,1);
                  if (*pcVar6 != 'Q') goto LAB_0036c784;
                  StringPiece::remove_prefix((StringPiece *)&tmp,2);
                  while (bVar1 = StringPiece::empty((StringPiece *)&tmp), ((bVar1 ^ 0xffU) & 1) != 0
                        ) {
                    sVar10 = StringPiece::size((StringPiece *)&tmp);
                    if (((1 < sVar10) &&
                        (pcVar6 = StringPiece::operator[]((StringPiece *)&tmp,0), *pcVar6 == '\\'))
                       && (pcVar6 = StringPiece::operator[]((StringPiece *)&tmp,1), *pcVar6 == 'E'))
                    {
                      StringPiece::remove_prefix((StringPiece *)&tmp,2);
                      break;
                    }
                    iVar3 = StringPieceToRune((Rune *)((long)&re_1 + 4),(StringPiece *)&tmp,
                                              (RegexpStatus *)xstatus.tmp_);
                    if (iVar3 < 0) {
                      s_local = (StringPiece *)0x0;
                      goto LAB_0036cc89;
                    }
                    bVar1 = ParseState::PushLiteral((ParseState *)local_78,re_1._4_4_);
                    if (!bVar1) {
                      s_local = (StringPiece *)0x0;
                      goto LAB_0036cc89;
                    }
                  }
                }
              }
            }
          }
        }
        else {
          pcVar6 = StringPiece::operator[]((StringPiece *)&tmp,1);
          bVar1 = ParseState::PushWordBoundary((ParseState *)local_78,*pcVar6 == 'b');
          if (!bVar1) {
            s_local = (StringPiece *)0x0;
            goto LAB_0036cc89;
          }
          StringPiece::remove_prefix((StringPiece *)&tmp,2);
        }
        break;
      case '^':
        bVar1 = ParseState::PushCaret((ParseState *)local_78);
        if (!bVar1) {
          s_local = (StringPiece *)0x0;
          goto LAB_0036cc89;
        }
        StringPiece::remove_prefix((StringPiece *)&tmp,1);
        break;
      case '{':
        _auStack_158 = tmp;
        opstr_1.data_ = t.data_;
        bVar1 = MaybeParseRepetition
                          ((StringPiece *)&tmp,(int *)((long)&opstr_1.size_ + 4),
                           (int *)&opstr_1.size_);
        if (bVar1) {
          local_159 = 0;
          PVar2 = ParseState::flags((ParseState *)local_78);
          PVar2 = operator&(PVar2,PerlX);
          if (PVar2 != NoParseFlags) {
            bVar1 = StringPiece::empty((StringPiece *)&tmp);
            if ((!bVar1) &&
               (pcVar6 = StringPiece::operator[]((StringPiece *)&tmp,0), *pcVar6 == '?')) {
              local_159 = 1;
              StringPiece::remove_prefix((StringPiece *)&tmp,1);
            }
            bVar1 = StringPiece::empty((StringPiece *)&isunary.size_);
            if (!bVar1) {
              RegexpStatus::set_code((RegexpStatus *)xstatus.tmp_,kRegexpRepeatOp);
              pcVar7 = StringPiece::data((StringPiece *)&isunary.size_);
              pcVar8 = StringPiece::data((StringPiece *)&tmp);
              pcVar9 = StringPiece::data((StringPiece *)&isunary.size_);
              StringPiece::StringPiece(&local_170,pcVar7,(long)pcVar8 - (long)pcVar9);
              RegexpStatus::set_error_arg((RegexpStatus *)xstatus.tmp_,&local_170);
              s_local = (StringPiece *)0x0;
              goto LAB_0036cc89;
            }
          }
          pcVar7 = StringPiece::data((StringPiece *)auStack_158);
          pcVar8 = StringPiece::data((StringPiece *)&tmp);
          pcVar9 = StringPiece::data((StringPiece *)auStack_158);
          StringPiece::StringPiece((StringPiece *)auStack_180,pcVar7,(long)pcVar8 - (long)pcVar9);
          _auStack_158 = _auStack_180;
          opstr_1.data_ = pcStack_178;
          bVar1 = ParseState::PushRepetition
                            ((ParseState *)local_78,opstr_1.size_._4_4_,(int)opstr_1.size_,
                             (StringPiece *)auStack_158,(bool)(local_159 & 1));
          if (!bVar1) {
            s_local = (StringPiece *)0x0;
            goto LAB_0036cc89;
          }
          _auStack_d8 = _auStack_158;
          isunary.data_ = opstr_1.data_;
        }
        else {
          bVar1 = ParseState::PushLiteral((ParseState *)local_78,0x7b);
          if (!bVar1) {
            s_local = (StringPiece *)0x0;
            goto LAB_0036cc89;
          }
          StringPiece::remove_prefix((StringPiece *)&tmp,1);
        }
        break;
      case '|':
        bVar1 = ParseState::DoVerticalBar((ParseState *)local_78);
        if (!bVar1) {
          s_local = (StringPiece *)0x0;
          goto LAB_0036cc89;
        }
        StringPiece::remove_prefix((StringPiece *)&tmp,1);
      }
      isunary.size_ = (size_type)_auStack_d8;
      lastunary.data_ = isunary.data_;
    }
    s_local = (StringPiece *)ParseState::DoFinish((ParseState *)local_78);
  }
  else {
    do {
      bVar1 = StringPiece::empty((StringPiece *)&tmp);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        s_local = (StringPiece *)ParseState::DoFinish((ParseState *)local_78);
        goto LAB_0036cc89;
      }
      iVar3 = StringPieceToRune((Rune *)((long)&lastunary.size_ + 4),(StringPiece *)&tmp,
                                (RegexpStatus *)xstatus.tmp_);
      if (iVar3 < 0) {
        s_local = (StringPiece *)0x0;
        goto LAB_0036cc89;
      }
      bVar1 = ParseState::PushLiteral((ParseState *)local_78,lastunary.size_._4_4_);
    } while (bVar1);
    s_local = (StringPiece *)0x0;
  }
LAB_0036cc89:
  lastunary.size_._0_4_ = 1;
  ParseState::~ParseState((ParseState *)local_78);
  RegexpStatus::~RegexpStatus((RegexpStatus *)&ps.ncap_);
  return (Regexp *)s_local;
}

Assistant:

Regexp* Regexp::Parse(const StringPiece& s, ParseFlags global_flags,
                      RegexpStatus* status) {
  // Make status non-NULL (easier on everyone else).
  RegexpStatus xstatus;
  if (status == NULL)
    status = &xstatus;

  ParseState ps(global_flags, s, status);
  StringPiece t = s;

  // Convert regexp to UTF-8 (easier on the rest of the parser).
  if (global_flags & Latin1) {
    std::string* tmp = new std::string;
    ConvertLatin1ToUTF8(t, tmp);
    status->set_tmp(tmp);
    t = *tmp;
  }

  if (global_flags & Literal) {
    // Special parse loop for literal string.
    while (!t.empty()) {
      Rune r;
      if (StringPieceToRune(&r, &t, status) < 0)
        return NULL;
      if (!ps.PushLiteral(r))
        return NULL;
    }
    return ps.DoFinish();
  }

  StringPiece lastunary = StringPiece();
  while (!t.empty()) {
    StringPiece isunary = StringPiece();
    switch (t[0]) {
      default: {
        Rune r;
        if (StringPieceToRune(&r, &t, status) < 0)
          return NULL;
        if (!ps.PushLiteral(r))
          return NULL;
        break;
      }

      case '(':
        // "(?" introduces Perl escape.
        if ((ps.flags() & PerlX) && (t.size() >= 2 && t[1] == '?')) {
          // Flag changes and non-capturing groups.
          if (!ps.ParsePerlFlags(&t))
            return NULL;
          break;
        }
        if (ps.flags() & NeverCapture) {
          if (!ps.DoLeftParenNoCapture())
            return NULL;
        } else {
          if (!ps.DoLeftParen(StringPiece()))
            return NULL;
        }
        t.remove_prefix(1);  // '('
        break;

      case '|':
        if (!ps.DoVerticalBar())
          return NULL;
        t.remove_prefix(1);  // '|'
        break;

      case ')':
        if (!ps.DoRightParen())
          return NULL;
        t.remove_prefix(1);  // ')'
        break;

      case '^':  // Beginning of line.
        if (!ps.PushCaret())
          return NULL;
        t.remove_prefix(1);  // '^'
        break;

      case '$':  // End of line.
        if (!ps.PushDollar())
          return NULL;
        t.remove_prefix(1);  // '$'
        break;

      case '.':  // Any character (possibly except newline).
        if (!ps.PushDot())
          return NULL;
        t.remove_prefix(1);  // '.'
        break;

      case '[': {  // Character class.
        Regexp* re;
        if (!ps.ParseCharClass(&t, &re, status))
          return NULL;
        if (!ps.PushRegexp(re))
          return NULL;
        break;
      }

      case '*': {  // Zero or more.
        RegexpOp op;
        op = kRegexpStar;
        goto Rep;
      case '+':  // One or more.
        op = kRegexpPlus;
        goto Rep;
      case '?':  // Zero or one.
        op = kRegexpQuest;
        goto Rep;
      Rep:
        StringPiece opstr = t;
        bool nongreedy = false;
        t.remove_prefix(1);  // '*' or '+' or '?'
        if (ps.flags() & PerlX) {
          if (!t.empty() && t[0] == '?') {
            nongreedy = true;
            t.remove_prefix(1);  // '?'
          }
          if (!lastunary.empty()) {
            // In Perl it is not allowed to stack repetition operators:
            //   a** is a syntax error, not a double-star.
            // (and a++ means something else entirely, which we don't support!)
            status->set_code(kRegexpRepeatOp);
            status->set_error_arg(StringPiece(
                lastunary.data(),
                static_cast<size_t>(t.data() - lastunary.data())));
            return NULL;
          }
        }
        opstr = StringPiece(opstr.data(),
                            static_cast<size_t>(t.data() - opstr.data()));
        if (!ps.PushRepeatOp(op, opstr, nongreedy))
          return NULL;
        isunary = opstr;
        break;
      }

      case '{': {  // Counted repetition.
        int lo, hi;
        StringPiece opstr = t;
        if (!MaybeParseRepetition(&t, &lo, &hi)) {
          // Treat like a literal.
          if (!ps.PushLiteral('{'))
            return NULL;
          t.remove_prefix(1);  // '{'
          break;
        }
        bool nongreedy = false;
        if (ps.flags() & PerlX) {
          if (!t.empty() && t[0] == '?') {
            nongreedy = true;
            t.remove_prefix(1);  // '?'
          }
          if (!lastunary.empty()) {
            // Not allowed to stack repetition operators.
            status->set_code(kRegexpRepeatOp);
            status->set_error_arg(StringPiece(
                lastunary.data(),
                static_cast<size_t>(t.data() - lastunary.data())));
            return NULL;
          }
        }
        opstr = StringPiece(opstr.data(),
                            static_cast<size_t>(t.data() - opstr.data()));
        if (!ps.PushRepetition(lo, hi, opstr, nongreedy))
          return NULL;
        isunary = opstr;
        break;
      }

      case '\\': {  // Escaped character or Perl sequence.
        // \b and \B: word boundary or not
        if ((ps.flags() & Regexp::PerlB) &&
            t.size() >= 2 && (t[1] == 'b' || t[1] == 'B')) {
          if (!ps.PushWordBoundary(t[1] == 'b'))
            return NULL;
          t.remove_prefix(2);  // '\\', 'b'
          break;
        }

        if ((ps.flags() & Regexp::PerlX) && t.size() >= 2) {
          if (t[1] == 'A') {
            if (!ps.PushSimpleOp(kRegexpBeginText))
              return NULL;
            t.remove_prefix(2);  // '\\', 'A'
            break;
          }
          if (t[1] == 'z') {
            if (!ps.PushSimpleOp(kRegexpEndText))
              return NULL;
            t.remove_prefix(2);  // '\\', 'z'
            break;
          }
          // Do not recognize \Z, because this library can't
          // implement the exact Perl/PCRE semantics.
          // (This library treats "(?-m)$" as \z, even though
          // in Perl and PCRE it is equivalent to \Z.)

          if (t[1] == 'C') {  // \C: any byte [sic]
            if (!ps.PushSimpleOp(kRegexpAnyByte))
              return NULL;
            t.remove_prefix(2);  // '\\', 'C'
            break;
          }

          if (t[1] == 'Q') {  // \Q ... \E: the ... is always literals
            t.remove_prefix(2);  // '\\', 'Q'
            while (!t.empty()) {
              if (t.size() >= 2 && t[0] == '\\' && t[1] == 'E') {
                t.remove_prefix(2);  // '\\', 'E'
                break;
              }
              Rune r;
              if (StringPieceToRune(&r, &t, status) < 0)
                return NULL;
              if (!ps.PushLiteral(r))
                return NULL;
            }
            break;
          }
        }

        if (t.size() >= 2 && (t[1] == 'p' || t[1] == 'P')) {
          Regexp* re = new Regexp(kRegexpCharClass, ps.flags() & ~FoldCase);
          re->ccb_ = new CharClassBuilder;
          switch (ParseUnicodeGroup(&t, ps.flags(), re->ccb_, status)) {
            case kParseOk:
              if (!ps.PushRegexp(re))
                return NULL;
              goto Break2;
            case kParseError:
              re->Decref();
              return NULL;
            case kParseNothing:
              re->Decref();
              break;
          }
        }

        const UGroup *g = MaybeParsePerlCCEscape(&t, ps.flags());
        if (g != NULL) {
          Regexp* re = new Regexp(kRegexpCharClass, ps.flags() & ~FoldCase);
          re->ccb_ = new CharClassBuilder;
          AddUGroup(re->ccb_, g, g->sign, ps.flags());
          if (!ps.PushRegexp(re))
            return NULL;
          break;
        }

        Rune r;
        if (!ParseEscape(&t, &r, status, ps.rune_max()))
          return NULL;
        if (!ps.PushLiteral(r))
          return NULL;
        break;
      }
    }
  Break2:
    lastunary = isunary;
  }
  return ps.DoFinish();
}